

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O2

int Bits::FindLSBSetNonZero_Portable(uint32 n)

{
  int rc;
  int iVar1;
  int shift;
  ulong uVar2;
  int i;
  int iVar3;
  uint32 uVar4;
  
  uVar2 = 0x10;
  iVar1 = 0x1f;
  for (iVar3 = 4; -1 < iVar3; iVar3 = iVar3 + -1) {
    uVar4 = n << (sbyte)uVar2;
    if (n << (sbyte)uVar2 != 0) {
      n = uVar4;
      uVar4 = (uint32)uVar2;
    }
    iVar1 = iVar1 - uVar4;
    uVar2 = uVar2 >> 1;
  }
  return iVar1;
}

Assistant:

int Bits::FindLSBSetNonZero_Portable(uint32 n) {
  int rc = 31;
  for (int i = 4, shift = 1 << 4; i >= 0; --i) {
    const uint32 x = n << shift;
    if (x != 0) {
      n = x;
      rc -= shift;
    }
    shift >>= 1;
  }
  return rc;
}